

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDsd.c
# Opt level: O1

Abc_Ntk_t * Abc_NtkSparsify(Abc_Ntk_t *pNtk,int nPerc,int fVerbose)

{
  int iVar1;
  Abc_Ntk_t *pNtk_00;
  
  if (pNtk->nObjCounts[8] != 0) {
    __assert_fail("Abc_NtkIsComb(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDsd.c"
                  ,0x2aa,"Abc_Ntk_t *Abc_NtkSparsify(Abc_Ntk_t *, int, int)");
  }
  if ((pNtk->ntkFunc == ABC_FUNC_BDD) && (pNtk->ntkType == ABC_NTK_LOGIC)) {
    pNtk_00 = Abc_NtkSparsifyInternal(pNtk,nPerc,fVerbose);
    if (pNtk_00 != (Abc_Ntk_t *)0x0) {
      iVar1 = Abc_NtkCheck(pNtk_00);
      if (iVar1 != 0) {
        return pNtk_00;
      }
      puts("Abc_NtkSparsify: The network check has failed.");
      Abc_NtkDelete(pNtk_00);
    }
    return (Abc_Ntk_t *)0x0;
  }
  __assert_fail("Abc_NtkIsBddLogic(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDsd.c"
                ,0x2ab,"Abc_Ntk_t *Abc_NtkSparsify(Abc_Ntk_t *, int, int)");
}

Assistant:

Abc_Ntk_t * Abc_NtkSparsify( Abc_Ntk_t * pNtk, int nPerc, int fVerbose )
{
    Abc_Ntk_t * pNtkNew;
    assert( Abc_NtkIsComb(pNtk) );
    assert( Abc_NtkIsBddLogic(pNtk) );
    pNtkNew = Abc_NtkSparsifyInternal( pNtk, nPerc, fVerbose );
    if ( pNtkNew == NULL )
        return NULL;
    if ( !Abc_NtkCheck( pNtkNew ) )
    {
        printf( "Abc_NtkSparsify: The network check has failed.\n" );
        Abc_NtkDelete( pNtkNew );
        return NULL;
    }
    return pNtkNew;
}